

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O1

STAmount * jbcoin::multiply(STAmount *__return_storage_ptr__,STAmount *v1,STAmount *v2,Issue *issue)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  mantissa_type mVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  mantissa_type mVar9;
  exponent_type eVar10;
  mantissa_type mVar11;
  exponent_type eVar12;
  bool bVar13;
  STAmount local_78;
  
  if ((v1->mValue == 0) || (v2->mValue == 0)) {
    (__return_storage_ptr__->super_STBase).fName = (SField *)sfGeneric;
    (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
    uVar2 = *(undefined8 *)((issue->currency).pn + 2);
    uVar3 = *(undefined8 *)((issue->currency).pn + 4);
    uVar4 = *(undefined8 *)((issue->account).pn + 1);
    *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn =
         *(undefined8 *)(issue->currency).pn;
    *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) = uVar2;
    *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = uVar3;
    *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) = uVar4;
    *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) =
         *(undefined8 *)((issue->account).pn + 3);
    __return_storage_ptr__->mValue = 0;
    __return_storage_ptr__->mOffset = 0;
    __return_storage_ptr__->mIsNegative = false;
    goto LAB_001a9704;
  }
  if ((v1->mIsNative == true) && (v2->mIsNative == true)) {
    local_78.super_STBase.fName = (SField *)sfGeneric;
    local_78.super_STBase._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
    local_78.mIssue.currency.pn._0_8_ = *(undefined8 *)(issue->currency).pn;
    local_78.mIssue.currency.pn._8_8_ = *(undefined8 *)((issue->currency).pn + 2);
    local_78.mIssue._16_8_ = *(undefined8 *)((issue->currency).pn + 4);
    local_78.mIssue.account.pn._4_8_ = *(undefined8 *)((issue->account).pn + 1);
    local_78.mIssue.account.pn._12_8_ = *(undefined8 *)((issue->account).pn + 3);
    local_78.mValue = 0;
    local_78.mOffset = 0;
    local_78.mIsNegative = false;
    STAmount::canonicalize(&local_78);
    if (local_78.mIssue.currency.pn[0] != 0) goto LAB_001a9597;
    uVar7 = 0;
    do {
      uVar8 = uVar7;
      if (uVar8 == 4) {
        uVar8 = 4;
        break;
      }
      uVar7 = uVar8 + 1;
    } while (local_78.mIssue.currency.pn[uVar8 + 1] == 0);
    bVar13 = 3 < uVar8;
  }
  else {
LAB_001a9597:
    bVar13 = false;
  }
  if (bVar13) {
    if ((v1->mIsNative == false) || (v2->mIsNative == false)) {
      Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"amount is not native!");
    }
    uVar7 = -v1->mValue;
    if (v1->mIsNegative == false) {
      uVar7 = v1->mValue;
    }
    mVar5 = -v2->mValue;
    if (v2->mIsNegative == false) {
      mVar5 = v2->mValue;
    }
    mVar9 = mVar5;
    if ((long)uVar7 < (long)mVar5) {
      mVar9 = uVar7;
    }
    if (mVar9 < 0xb2d05e01) {
      mVar11 = mVar5;
      if ((long)mVar5 < (long)uVar7) {
        mVar11 = uVar7;
      }
      if ((mVar11 >> 0x20) * mVar9 < 0x7ce66c51) {
        (__return_storage_ptr__->super_STBase).fName = (v1->super_STBase).fName;
        (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
        (__return_storage_ptr__->mIssue).currency.pn[0] = 0;
        (__return_storage_ptr__->mIssue).currency.pn[1] = 0;
        (__return_storage_ptr__->mIssue).currency.pn[2] = 0;
        (__return_storage_ptr__->mIssue).currency.pn[3] = 0;
        *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = 0;
        (__return_storage_ptr__->mIssue).account.pn[1] = 0;
        (__return_storage_ptr__->mIssue).account.pn[2] = 0;
        (__return_storage_ptr__->mIssue).account.pn[3] = 0;
        (__return_storage_ptr__->mIssue).account.pn[4] = 0;
        __return_storage_ptr__->mValue = mVar5 * uVar7;
        __return_storage_ptr__->mOffset = 0;
        __return_storage_ptr__->mIsNative = true;
        __return_storage_ptr__->mIsNegative = false;
        return __return_storage_ptr__;
      }
    }
    Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"Native value overflow");
  }
  uVar7 = v1->mValue;
  uVar8 = v2->mValue;
  eVar12 = v1->mOffset;
  if ((uVar7 < 1000000000000000) && (v1->mIsNative != false)) {
    do {
      uVar7 = uVar7 * 10;
      eVar12 = eVar12 + -1;
    } while (uVar7 < 1000000000000000);
  }
  eVar10 = v2->mOffset;
  if ((uVar8 < 1000000000000000) && (v2->mIsNative != false)) {
    do {
      uVar8 = uVar8 * 10;
      eVar10 = eVar10 + -1;
    } while (uVar8 < 1000000000000000);
  }
  uVar6 = muldiv(uVar7,uVar8,100000000000000);
  bVar13 = v1->mIsNegative;
  bVar1 = v2->mIsNegative;
  (__return_storage_ptr__->super_STBase).fName = (SField *)sfGeneric;
  (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
  uVar2 = *(undefined8 *)((issue->currency).pn + 2);
  uVar3 = *(undefined8 *)((issue->currency).pn + 4);
  uVar4 = *(undefined8 *)((issue->account).pn + 1);
  *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn = *(undefined8 *)(issue->currency).pn;
  *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) = uVar2;
  *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = uVar3;
  *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) = uVar4;
  *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) =
       *(undefined8 *)((issue->account).pn + 3);
  __return_storage_ptr__->mValue = uVar6 + 7;
  __return_storage_ptr__->mOffset = eVar12 + 0xe + eVar10;
  __return_storage_ptr__->mIsNegative = bVar13 != bVar1;
LAB_001a9704:
  STAmount::canonicalize(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

STAmount
multiply (STAmount const& v1, STAmount const& v2, Issue const& issue)
{
    if (v1 == zero || v2 == zero)
        return STAmount (issue);

    if (v1.native() && v2.native() && isXRP (issue))
    {
        std::uint64_t const minV = getSNValue (v1) < getSNValue (v2)
                ? getSNValue (v1) : getSNValue (v2);
        std::uint64_t const maxV = getSNValue (v1) < getSNValue (v2)
                ? getSNValue (v2) : getSNValue (v1);

        if (minV > 3000000000ull) // sqrt(cMaxNative)
            Throw<std::runtime_error> ("Native value overflow");

        if (((maxV >> 32) * minV) > 2095475792ull) // cMaxNative / 2^32
            Throw<std::runtime_error> ("Native value overflow");

        return STAmount (v1.getFName (), minV * maxV);
    }

    std::uint64_t value1 = v1.mantissa();
    std::uint64_t value2 = v2.mantissa();
    int offset1 = v1.exponent();
    int offset2 = v2.exponent();

    if (v1.native())
    {
        while (value1 < STAmount::cMinValue)
        {
            value1 *= 10;
            --offset1;
        }
    }

    if (v2.native())
    {
        while (value2 < STAmount::cMinValue)
        {
            value2 *= 10;
            --offset2;
        }
    }

    // We multiply the two mantissas (each is between 10^15
    // and 10^16), so their product is in the 10^30 to 10^32
    // range. Dividing their product by 10^14 maintains the
    // precision, by scaling the result to 10^16 to 10^18.
    return STAmount (issue,
        muldiv(value1, value2, tenTo14) + 7,
        offset1 + offset2 + 14,
        v1.negative() != v2.negative());
}